

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManPrint(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManAndNum(p);
  iVar2 = Gia_ManXorNum(p);
  iVar3 = Gia_ManMuxNum(p);
  uVar4 = Gia_ManXorNum(p);
  uVar5 = Gia_ManMuxNum(p);
  printf("GIA manager has %d ANDs, %d XORs, %d MUXes.\n",(ulong)(uint)((iVar1 - iVar2) - iVar3),
         (ulong)uVar4,(ulong)uVar5);
  local_1c = 0;
  while( true ) {
    bVar6 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar6 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    Gia_ObjPrint(p,pGStack_18);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_ManPrint( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    printf( "GIA manager has %d ANDs, %d XORs, %d MUXes.\n", 
        Gia_ManAndNum(p) - Gia_ManXorNum(p) - Gia_ManMuxNum(p), Gia_ManXorNum(p), Gia_ManMuxNum(p) ); 
    Gia_ManForEachObj( p, pObj, i )
        Gia_ObjPrint( p, pObj );
}